

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraDasm_cpp.h
# Opt level: O3

void __thiscall
moira::Moira::dasmAddqDn<(moira::Instr)4,(moira::Mode)0,2>
          (Moira *this,StrWriter *str,u32 *addr,u16 op)

{
  char **s;
  Syntax SVar1;
  int iVar2;
  byte bVar3;
  char cVar4;
  char *pcVar5;
  long lVar6;
  Int i;
  
  bVar3 = 8;
  if ((op & 0xe00) != 0) {
    bVar3 = (byte)(op >> 9) & 7;
  }
  s = &str->ptr;
  if (str->style->syntax == MUSASHI) {
    cVar4 = 'a';
    lVar6 = 0;
    do {
      pcVar5 = *s;
      *s = pcVar5 + 1;
      *pcVar5 = cVar4;
      cVar4 = "addq"[lVar6 + 1];
      lVar6 = lVar6 + 1;
    } while (lVar6 != 4);
    pcVar5 = str->ptr;
    SVar1 = str->style->syntax;
    str->ptr = pcVar5 + 1;
    if (2 < SVar1 - MOIRA_MIT) {
      *pcVar5 = '.';
      pcVar5 = *s;
      *s = pcVar5 + 1;
    }
    *pcVar5 = 'w';
    if ((str->style->syntax & ~MOIRA_MIT) == GNU) {
      pcVar5 = *s;
      *s = pcVar5 + 1;
      *pcVar5 = ' ';
      pcVar5 = *s;
    }
    else {
      iVar2 = (str->tab).raw;
      pcVar5 = str->ptr;
      do {
        str->ptr = pcVar5 + 1;
        *pcVar5 = ' ';
        pcVar5 = str->ptr;
      } while (pcVar5 < str->base + iVar2);
    }
    str->ptr = pcVar5 + 1;
    *pcVar5 = '#';
    sprintd(s,(ulong)bVar3);
  }
  else {
    cVar4 = 'a';
    lVar6 = 0;
    do {
      pcVar5 = *s;
      *s = pcVar5 + 1;
      *pcVar5 = cVar4;
      cVar4 = "addq"[lVar6 + 1];
      lVar6 = lVar6 + 1;
    } while (lVar6 != 4);
    pcVar5 = str->ptr;
    SVar1 = str->style->syntax;
    str->ptr = pcVar5 + 1;
    if (2 < SVar1 - MOIRA_MIT) {
      *pcVar5 = '.';
      pcVar5 = *s;
      *s = pcVar5 + 1;
    }
    *pcVar5 = 'w';
    if ((str->style->syntax & ~MOIRA_MIT) == GNU) {
      pcVar5 = *s;
      *s = pcVar5 + 1;
      *pcVar5 = ' ';
      pcVar5 = *s;
    }
    else {
      iVar2 = (str->tab).raw;
      pcVar5 = str->ptr;
      do {
        str->ptr = pcVar5 + 1;
        *pcVar5 = ' ';
        pcVar5 = str->ptr;
      } while (pcVar5 < str->base + iVar2);
    }
    str->ptr = pcVar5 + 1;
    *pcVar5 = '#';
    i.raw._1_3_ = 0;
    i.raw._0_1_ = bVar3;
    StrWriter::operator<<(str,i);
  }
  pcVar5 = str->ptr;
  str->ptr = pcVar5 + 1;
  *pcVar5 = ',';
  SVar1 = str->style->syntax;
  if ((SVar1 < (MUSASHI|MOIRA_MIT)) && ((0x13U >> (SVar1 & 0x1f) & 1) != 0)) {
    pcVar5 = *s;
    *s = pcVar5 + 1;
    *pcVar5 = ' ';
  }
  StrWriter::operator<<(str,(Dn)(op & 7));
  return;
}

Assistant:

void
Moira::dasmAddqDn(StrWriter &str, u32 &addr, u16 op) const
{
    auto src = ____xxx_________(op);
    auto dst = _____________xxx(op);

    if (src == 0) src = 8;

    switch (str.style.syntax) {

        case  Syntax::MUSASHI:

            str << Ins<I>{} << Sz<S>{} << str.tab << Imd{src} << Sep{} << Dn{dst};
            break;

        default:

            str << Ins<I>{} << Sz<S>{} << str.tab << Ims<S>{src} << Sep{} << Dn{dst};
    }
}